

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::_InternalParse
          (ItemSimilarityRecommender_SimilarItems *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint64_t uVar2;
  ItemSimilarityRecommender_ConnectedItem *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar3;
  char cVar4;
  uint32_t tag;
  double *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = (double *)ptr;
LAB_002938c6:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_48);
    if (bVar1) {
      return (char *)local_48;
    }
    local_48 = (double *)google::protobuf::internal::ReadTag((char *)local_48,&local_3c,0);
    tag_00 = local_3c;
    uVar3 = local_3c >> 3;
    cVar4 = (char)local_3c;
    if (uVar3 == 3) {
      if (cVar4 == '\x19') {
        this->itemscoreadjustment_ = *local_48;
        local_48 = local_48 + 1;
        goto LAB_002938c6;
      }
LAB_00293983:
      if ((local_3c == 0) || ((local_3c & 7) == 4)) {
        if (local_48 == (double *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        return (char *)local_48;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>(local_38);
      local_48 = (double *)
                 google::protobuf::internal::UnknownFieldParse(tag_00,unknown,(char *)local_48,ctx);
    }
    else {
      if (uVar3 == 2) {
        if (cVar4 != '\x12') goto LAB_00293983;
        local_48 = (double *)((long)local_48 + -1);
        do {
          local_48 = (double *)((long)local_48 + 1);
          msg = google::protobuf::
                RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::
                Add(&this->similaritemlist_);
          local_48 = (double *)
                     google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,(char *)local_48);
          if (local_48 == (double *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(char *)local_48 == '\x12'));
        goto LAB_002938c6;
      }
      if ((uVar3 != 1) || (cVar4 != '\b')) goto LAB_00293983;
      uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
      this->itemid_ = uVar2;
    }
    if (local_48 == (double *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ItemSimilarityRecommender_SimilarItems::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 itemId = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          itemid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.ItemSimilarityRecommender.ConnectedItem similarItemList = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_similaritemlist(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // double itemScoreAdjustment = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 25)) {
          itemscoreadjustment_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}